

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  unsigned_short uVar1;
  stbrp_coord sVar2;
  int iVar3;
  uint uVar4;
  ImFontAtlasCustomRect *pIVar5;
  stbrp_rect *psVar6;
  long in_RSI;
  long in_RDI;
  bool bVar7;
  int i_1;
  int i;
  ImVector<stbrp_rect> pack_rects;
  ImVector<ImFontAtlasCustomRect> *user_rects;
  stbrp_context *pack_context;
  uint in_stack_fffffffffffffedc;
  stbrp_rect *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  stbrp_context *in_stack_ffffffffffffff00;
  int local_44;
  int local_40;
  ImVector<stbrp_rect> local_30;
  int *local_20;
  long local_8;
  
  if (in_RSI == 0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8b7,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  local_20 = (int *)(in_RDI + 0x50);
  if (0 < *local_20) {
    local_8 = in_RDI;
    ImVector<stbrp_rect>::ImVector(&local_30);
    ImVector<stbrp_rect>::resize
              ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    iVar3 = ImVector<stbrp_rect>::size_in_bytes(&local_30);
    memset(local_30.Data,0,(long)iVar3);
    for (local_40 = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20), local_40 < *local_20
        ; local_40 = local_40 + 1) {
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                         ((ImVector<ImFontAtlasCustomRect> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
      uVar1 = pIVar5->Width;
      psVar6 = ImVector<stbrp_rect>::operator[]
                         ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
      psVar6->w = uVar1;
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                         ((ImVector<ImFontAtlasCustomRect> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
      uVar1 = pIVar5->Height;
      psVar6 = ImVector<stbrp_rect>::operator[]
                         ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
      psVar6->h = uVar1;
    }
    ImVector<stbrp_rect>::operator[]
              ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    stbrp_pack_rects(in_stack_ffffffffffffff00,
                     (stbrp_rect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     iVar3);
    local_44 = 0;
    do {
      if (local_30.Size <= local_44) {
        ImVector<stbrp_rect>::~ImVector((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0);
        return;
      }
      psVar6 = ImVector<stbrp_rect>::operator[]
                         ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
      if (psVar6->was_packed != 0) {
        psVar6 = ImVector<stbrp_rect>::operator[]
                           ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        sVar2 = psVar6->x;
        pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                           ((ImVector<ImFontAtlasCustomRect> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        pIVar5->X = sVar2;
        psVar6 = ImVector<stbrp_rect>::operator[]
                           ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        sVar2 = psVar6->y;
        pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                           ((ImVector<ImFontAtlasCustomRect> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        pIVar5->Y = sVar2;
        psVar6 = ImVector<stbrp_rect>::operator[]
                           ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        sVar2 = psVar6->w;
        pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                           ((ImVector<ImFontAtlasCustomRect> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        bVar7 = false;
        if (sVar2 == pIVar5->Width) {
          psVar6 = ImVector<stbrp_rect>::operator[]
                             ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffedc);
          uVar4 = (uint)psVar6->h;
          pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                             ((ImVector<ImFontAtlasCustomRect> *)in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffedc);
          bVar7 = uVar4 == pIVar5->Height;
        }
        if (!bVar7) {
          __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                        ,0x8ca,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
        }
        iVar3 = *(int *)(local_8 + 0x2c);
        psVar6 = ImVector<stbrp_rect>::operator[]
                           ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        in_stack_fffffffffffffedc = (uint)psVar6->y;
        in_stack_fffffffffffffee0 =
             ImVector<stbrp_rect>::operator[]
                       ((ImVector<stbrp_rect> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc)
        ;
        iVar3 = ImMax<int>(iVar3,in_stack_fffffffffffffedc + in_stack_fffffffffffffee0->h);
        *(int *)(local_8 + 0x2c) = iVar3;
      }
      local_44 = local_44 + 1;
    } while( true );
  }
  __assert_fail("user_rects.Size >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                ,0x8ba,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}